

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O0

void __thiscall FloatInterval_Sub_Test::~FloatInterval_Sub_Test(FloatInterval_Sub_Test *this)

{
  void *in_RDI;
  
  ~FloatInterval_Sub_Test((FloatInterval_Sub_Test *)0x6086b8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(FloatInterval, Sub) {
    for (int trial = 0; trial < kFloatIntervalIters; ++trial) {
        RNG rng(trial);

        FloatInterval ef[2] = {getFloat(rng), getFloat(rng)};
        double precise[2] = {getPrecise(ef[0], rng), getPrecise(ef[1], rng)};

        FloatInterval efResult = ef[0] - ef[1];
        float preciseResult = precise[0] - precise[1];

        EXPECT_GE(preciseResult, efResult.LowerBound());
        EXPECT_LE(preciseResult, efResult.UpperBound());
    }
}